

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O2

void __thiscall
Dinic_BenchmarkV100E10000_Test::Dinic_BenchmarkV100E10000_Test(Dinic_BenchmarkV100E10000_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001530a8;
  return;
}

Assistant:

TEST(Dinic, BenchmarkV100E10000) {
    srand(1);
    int n = 100;
    int m = 30000;
    int range = 1000;
    Dinic d(n);
    rep(i, 0, m) {
        d.addEdge(rand() % n, rand() % n, range + rand() % range);
    }
    d.getFlow(0, n - 1);
}